

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_PitchDetector.cpp
# Opt level: O3

int PitchDetector::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  UnityComplexNumber *data;
  float fVar1;
  uint uVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  int iVar5;
  float fVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __n;
  float fVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  
  pfVar3 = (float *)(state->field_0).field_0.effectdata;
  if (pfVar3 == (float *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = PitchDetector::EffectData]")
    ;
  }
  if ((state->field_0).field_0.internal == (void *)0x0) {
    __assert_fail("internal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfe,
                  "T *UnityAudioEffectState::GetEffectData() const [T = PitchDetector::EffectData]")
    ;
  }
  uVar2 = (state->field_0).field_0.samplerate;
  fVar1 = pfVar3[7];
  fVar11 = exp2f(pfVar3[6] / 12.0);
  memcpy(outbuffer,inbuffer,(ulong)(inchannels * length) << 2);
  if (length != 0) {
    data = (UnityComplexNumber *)(pfVar3 + 0x400b);
    uVar9 = 0;
    uVar10 = 0;
    do {
      fVar12 = inbuffer[(uint)((int)uVar10 * inchannels)];
      pfVar3[9] = (ABS(fVar12) - pfVar3[9]) * 0.01 + pfVar3[9];
      fVar6 = pfVar3[8];
      pfVar3[(long)(int)fVar6 + 0xc0b] = fVar12;
      fVar6 = (float)((int)fVar6 + 1);
      pfVar3[8] = fVar6;
      if (fVar6 == 1.43493e-42) {
        pfVar3[8] = 0.0;
        memmove(pfVar3 + 0xb,pfVar3 + 0x40b,0x3000);
        lVar7 = 0x100b;
        do {
          auVar4._4_4_ = 0;
          auVar4._0_4_ = (float)*(undefined8 *)(pfVar3 + lVar7) *
                         (float)*(undefined8 *)(pfVar3 + lVar7 + -0x1000);
          auVar4._8_4_ = (float)((ulong)*(undefined8 *)(pfVar3 + lVar7) >> 0x20) *
                         (float)((ulong)*(undefined8 *)(pfVar3 + lVar7 + -0x1000) >> 0x20);
          auVar4._12_4_ = 0;
          *(undefined1 (*) [16])(pfVar3 + lVar7 * 2 + 0x1ff5) = auVar4;
          lVar7 = lVar7 + 2;
        } while (lVar7 != 0x200b);
        memset(pfVar3 + 0x600b,0,0x8000);
        FFT::Forward(data,0x2000,true);
        fVar12 = pfVar3[1];
        fVar6 = pfVar3[2];
        __n = (long)(int)fVar12 * 8;
        memset(data,0,__n);
        memset(data + (int)fVar6,0,(long)((int)fVar6 * -2 + 0x2000) << 3);
        memset(pfVar3 + (long)(int)fVar12 * -2 + 0x800b,0,__n);
        lVar7 = 0;
        do {
          fVar12 = *(float *)((long)pfVar3 + lVar7 * 2 + 0x1002c);
          fVar6 = *(float *)((long)pfVar3 + lVar7 * 2 + 0x10030);
          fVar12 = (fVar12 * fVar12 + fVar6 * fVar6) * pfVar3[uVar10 + 0x200b];
          *(float *)((long)pfVar3 + lVar7 * 2 + 0x1002c) = fVar12;
          *(undefined4 *)((long)pfVar3 + lVar7 * 2 + 0x10030) = 0;
          *(float *)((long)&debugdata + lVar7) = fVar12;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x8000);
        FFT::Backward(data,0x2000,true);
        iVar13 = (int)(float)*(undefined8 *)(pfVar3 + 3);
        iVar14 = (int)(float)((ulong)*(undefined8 *)(pfVar3 + 3) >> 0x20);
        if (iVar14 <= iVar13) goto LAB_0011521d;
        lVar7 = (long)iVar13;
        iVar13 = 0;
        fVar12 = 0.0;
        do {
          fVar6 = pfVar3[lVar7 * 2 + 0x400b];
          iVar5 = (int)lVar7;
          if (fVar6 <= fVar12) {
            fVar6 = fVar12;
            iVar5 = iVar13;
          }
          iVar13 = iVar5;
          lVar7 = lVar7 + 1;
          fVar12 = fVar6;
        } while (iVar14 != lVar7);
        fVar12 = *pfVar3;
        if ((pfVar3[5] <= pfVar3[9] && pfVar3[9] != pfVar3[5]) && (0 < iVar13)) {
          *(float *)(detected_freqs + (long)(int)fVar12 * 4) =
               (float)(state->field_0).field_0.samplerate / (float)iVar13;
        }
      }
      else {
LAB_0011521d:
        fVar12 = *pfVar3;
      }
      fVar12 = *(float *)(detected_freqs + (long)(int)fVar12 * 4) * (1.0 / (float)uVar2) * fVar11 +
               pfVar3[10];
      fVar6 = floorf(fVar12);
      pfVar3[10] = fVar12 - (float)(int)fVar6;
      iVar13 = (int)uVar9;
      uVar8 = (ulong)(uint)outchannels;
      if (0 < outchannels) {
        do {
          outbuffer[uVar9] =
               ((pfVar3[10] + pfVar3[10] + -1.0) * pfVar3[9] - outbuffer[uVar9]) * fVar1 +
               outbuffer[uVar9];
          uVar9 = (ulong)((int)uVar9 + 1);
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      uVar10 = uVar10 + 1;
      uVar9 = (ulong)(uint)(iVar13 + outchannels);
    } while (uVar10 != length);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        const float sampletime = 1.0f / state->samplerate;
        const float monitor = data->p[P_MONITOR];
        const float oscpitch = powf(2.0f, data->p[P_OSCPITCH] / 12.0f) * sampletime;

        memcpy(outbuffer, inbuffer, length * inchannels * sizeof(float));

        for (unsigned int n = 0; n < length; n++)
        {
            float input = inbuffer[n * inchannels];

            data->env += (fabsf(input) - data->env) * 0.01f;
            data->buffer[data->counter + WINSIZE - HOPSIZE] = input;

            if (++data->counter == HOPSIZE)
            {
                data->counter = 0;

                for (int i = 0; i < WINSIZE - HOPSIZE; i++)
                    data->buffer[i] = data->buffer[i + HOPSIZE];

                for (int i = 0; i < WINSIZE; i++)
                {
                    data->spec[i].re = data->buffer[i] * data->window[i];
                    data->spec[i].im = 0.0f;
                }

                for (int i = WINSIZE; i < FFTSIZE; i++)
                {
                    data->spec[i].re = 0.0f;
                    data->spec[i].im = 0.0f;
                }

                FFT::Forward(data->spec, FFTSIZE, true);

                int locut = (int)data->p[P_LOCUT];
                int hicut = (int)data->p[P_HICUT];
                memset(data->spec, 0, sizeof(UnityComplexNumber) * locut);
                memset(data->spec + hicut, 0, sizeof(UnityComplexNumber) * (FFTSIZE - 2 * hicut));
                memset(data->spec + FFTSIZE - locut, 0, sizeof(UnityComplexNumber) * locut);

                // Fast autocorrelation
                for (int i = 0; i < FFTSIZE; i++)
                {
                    data->spec[i].re = data->spec[i].Magnitude2() * data->acnf[n]; // Correct for windowing
                    data->spec[i].im = 0.0f;
                    debugdata[i] = data->spec[i].re;
                }
                FFT::Backward(data->spec, FFTSIZE, true);

                int startbin = (int)data->p[P_LOBIN];
                int endbin = (int)data->p[P_HIBIN];
                int maxbin = 0;
                float maxval = 0.0f;
                for (int n = startbin; n < endbin; n++)
                {
                    float a = data->spec[n].re;
                    if (a > maxval)
                    {
                        maxbin = n;
                        maxval = a;
                    }
                }

                if (data->env > data->p[P_THR] && maxbin > 0)
                    detected_freqs[(int)data->p[P_INDEX]] = (float)state->samplerate / (float)maxbin;
            }

            data->phase += detected_freqs[(int)data->p[P_INDEX]] * oscpitch;
            data->phase -= FastFloor(data->phase);

            for (int c = 0; c < outchannels; c++)
                outbuffer[n * outchannels + c] += ((data->phase * 2.0f - 1.0f) * data->env - outbuffer[n * outchannels + c]) * monitor;
        }

        return UNITY_AUDIODSP_OK;
    }